

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O2

bool __thiscall
glcts::StateInteractionCase::checkCSProg
          (StateInteractionCase *this,Functions *gl,GLuint program,int expectedLink)

{
  int linked;
  GLint local_2c;
  
  local_2c = 0;
  if (program == 0) {
    local_2c = 0;
  }
  else {
    (*gl->getProgramiv)(program,0x8b82,&local_2c);
    if (local_2c == 0 && expectedLink != 0) {
      logProgramInfoLog(this,gl,program);
    }
  }
  return local_2c == expectedLink && program != 0;
}

Assistant:

bool checkCSProg(const glw::Functions& gl, GLuint program, int expectedLink = GL_TRUE)
	{
		int linked = GL_FALSE;
		if (program != 0)
		{
			gl.getProgramiv(program, GL_LINK_STATUS, &linked);

			if (expectedLink && !linked)
			{
				logProgramInfoLog(gl, program);
			}
		}

		return (program != 0) && (linked == expectedLink);
	}